

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O3

void uv::AfterRecv(uv_stream_t *handle,ssize_t nread,uv_buf_t *buf)

{
  void *pvVar1;
  char *pcVar2;
  FILE *__stream;
  uint uVar3;
  int iVar4;
  int iVar5;
  ILog4zManager *pIVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  _func_int **pp_Var11;
  int iVar12;
  char *pcVar13;
  int iVar14;
  ulong *in_FS_OFFSET;
  string local_70;
  string local_50;
  
  __stream = _stdout;
  pvVar1 = handle->data;
  if (pvVar1 == (void *)0x0) {
    __assert_fail("theclass",
                  "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/tcpserver.cpp"
                  ,0x246,"void uv::AfterRecv(uv_stream_t *, ssize_t, const uv_buf_t *)");
  }
  iVar14 = (int)nread;
  if (-1 < nread) {
    if (nread == 0) {
      return;
    }
    PacketSync::recvdata(*(PacketSync **)((long)pvVar1 + 0xf8),(uchar *)buf->base,iVar14);
    return;
  }
  if (nread == -0x68) {
    fprintf(_stdout,"client(%d)conn reset\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
    pcVar2 = (char *)*in_FS_OFFSET;
    pcVar9 = pcVar2 + -0x800;
    builtin_strncpy(pcVar2 + -0x800,"client(",8);
    uVar3 = snprintf(pcVar2 + -0x7f9,0x7f9,"%d",(ulong)*(uint *)((long)pvVar1 + 0x110));
    iVar14 = (int)pcVar2;
    if ((int)uVar3 < 0) {
      pcVar2[-0x7f9] = '\0';
      pcVar13 = pcVar9;
LAB_00119e71:
      pcVar13 = pcVar13 + 7;
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s",")conn reset");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_00119eae:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_00119eae;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    else {
      if (uVar3 < 0x7f9) {
        pcVar13 = pcVar9 + uVar3;
        goto LAB_00119e71;
      }
      pcVar2[-1] = '\0';
      pcVar13 = pcVar2;
    }
    if (pcVar13 < pcVar2) {
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ( ");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_0011a067:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_0011a067;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    if (pcVar13 < pcVar2) {
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_0011a0af:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_0011a0af;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    if (pcVar13 < pcVar2) {
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ) : ");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_0011a0f7:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_0011a0f7;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    if (pcVar13 < pcVar2) {
      iVar14 = iVar14 - (int)pcVar13;
      uVar7 = 0x24d;
LAB_0011a11b:
      iVar5 = snprintf(pcVar13,(long)iVar14,"%d",uVar7);
      if (-1 < iVar5) {
        if (iVar5 < iVar14) goto LAB_0011a139;
        pcVar13 = pcVar9 + 0x7ff;
      }
      *pcVar13 = '\0';
    }
  }
  else {
    if (nread != -0xfff) {
      GetUVError_abi_cxx11_(&local_50,iVar14);
      fprintf(__stream,"%s\n",local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = (char *)*in_FS_OFFSET;
      pcVar9 = pcVar2 + -0x800;
      builtin_strncpy(pcVar2 + -0x800,"client(",8);
      uVar3 = snprintf(pcVar2 + -0x7f9,0x7f9,"%d",(ulong)*(uint *)((long)pvVar1 + 0x110));
      iVar5 = (int)pcVar2;
      if ((int)uVar3 < 0) {
        pcVar2[-0x7f9] = '\0';
        pcVar13 = pcVar9;
LAB_00119ec8:
        pcVar13 = pcVar13 + 7;
        iVar10 = iVar5 - (int)pcVar13;
        iVar12 = snprintf(pcVar13,(long)iVar10,"%s",anon_var_dwarf_e322);
        pcVar8 = pcVar13;
        iVar4 = 0;
        if (iVar12 < 0) {
LAB_00119f07:
          iVar12 = iVar4;
          *pcVar8 = '\0';
        }
        else if (iVar10 <= iVar12) {
          pcVar8 = pcVar2 + -1;
          iVar4 = iVar10;
          goto LAB_00119f07;
        }
        pcVar13 = pcVar13 + iVar12;
      }
      else {
        if (uVar3 < 0x7f9) {
          pcVar13 = pcVar9 + uVar3;
          goto LAB_00119ec8;
        }
        pcVar2[-1] = '\0';
        pcVar13 = pcVar2;
      }
      GetUVError_abi_cxx11_(&local_70,iVar14);
      if (pcVar13 < pcVar2) {
        iVar12 = iVar5 - (int)pcVar13;
        iVar4 = snprintf(pcVar13,(long)iVar12,"%s",local_70._M_dataplus._M_p);
        pcVar8 = pcVar13;
        iVar14 = 0;
        if (iVar4 < 0) {
LAB_0011a1a6:
          iVar4 = iVar14;
          *pcVar8 = '\0';
        }
        else if (iVar12 <= iVar4) {
          pcVar8 = pcVar2 + -1;
          iVar14 = iVar12;
          goto LAB_0011a1a6;
        }
        pcVar13 = pcVar13 + iVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (pcVar13 < pcVar2) {
        iVar12 = iVar5 - (int)pcVar13;
        iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ( ");
        pcVar8 = pcVar13;
        iVar14 = 0;
        if (iVar4 < 0) {
LAB_0011a209:
          iVar4 = iVar14;
          *pcVar8 = '\0';
        }
        else if (iVar12 <= iVar4) {
          pcVar8 = pcVar2 + -1;
          iVar14 = iVar12;
          goto LAB_0011a209;
        }
        pcVar13 = pcVar13 + iVar4;
      }
      if (pcVar13 < pcVar2) {
        iVar12 = iVar5 - (int)pcVar13;
        iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ");
        pcVar8 = pcVar13;
        iVar14 = 0;
        if (iVar4 < 0) {
LAB_0011a251:
          iVar4 = iVar14;
          *pcVar8 = '\0';
        }
        else if (iVar12 <= iVar4) {
          pcVar8 = pcVar2 + -1;
          iVar14 = iVar12;
          goto LAB_0011a251;
        }
        pcVar13 = pcVar13 + iVar4;
      }
      if (pcVar13 < pcVar2) {
        iVar12 = iVar5 - (int)pcVar13;
        iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ) : ");
        pcVar8 = pcVar13;
        iVar14 = 0;
        if (iVar4 < 0) {
LAB_0011a299:
          iVar4 = iVar14;
          *pcVar8 = '\0';
        }
        else if (iVar12 <= iVar4) {
          pcVar8 = pcVar2 + -1;
          iVar14 = iVar12;
          goto LAB_0011a299;
        }
        pcVar13 = pcVar13 + iVar4;
      }
      if (pcVar13 < pcVar2) {
        iVar5 = iVar5 - (int)pcVar13;
        iVar14 = snprintf(pcVar13,(long)iVar5,"%d",0x250);
        if (-1 < iVar14) {
          if (iVar14 < iVar5) goto LAB_0011a2db;
          pcVar13 = pcVar2 + -1;
        }
        *pcVar13 = '\0';
      }
LAB_0011a2db:
      pIVar6 = zsummer::log4z::ILog4zManager::GetInstance();
      pp_Var11 = pIVar6->_vptr_ILog4zManager;
      goto LAB_0011a2f0;
    }
    fprintf(_stdout,"client(%d)eof\n",(ulong)*(uint *)((long)pvVar1 + 0x110));
    pcVar2 = (char *)*in_FS_OFFSET;
    pcVar9 = pcVar2 + -0x800;
    builtin_strncpy(pcVar2 + -0x800,"client(",8);
    uVar3 = snprintf(pcVar2 + -0x7f9,0x7f9,"%d",(ulong)*(uint *)((long)pvVar1 + 0x110));
    iVar14 = (int)pcVar2;
    if ((int)uVar3 < 0) {
      pcVar2[-0x7f9] = '\0';
      pcVar13 = pcVar9;
LAB_00119e1e:
      pcVar13 = pcVar13 + 7;
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s",")eof");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_00119e5b:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_00119e5b;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    else {
      if (uVar3 < 0x7f9) {
        pcVar13 = pcVar9 + uVar3;
        goto LAB_00119e1e;
      }
      pcVar2[-1] = '\0';
      pcVar13 = pcVar2;
    }
    if (pcVar13 < pcVar2) {
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ( ");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_00119f62:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_00119f62;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    if (pcVar13 < pcVar2) {
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_00119faa:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_00119faa;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    if (pcVar13 < pcVar2) {
      iVar12 = iVar14 - (int)pcVar13;
      iVar4 = snprintf(pcVar13,(long)iVar12,"%s"," ) : ");
      pcVar8 = pcVar13;
      iVar5 = 0;
      if (iVar4 < 0) {
LAB_00119ff2:
        iVar4 = iVar5;
        *pcVar8 = '\0';
      }
      else if (iVar12 <= iVar4) {
        pcVar8 = pcVar2 + -1;
        iVar5 = iVar12;
        goto LAB_00119ff2;
      }
      pcVar13 = pcVar13 + iVar4;
    }
    if (pcVar13 < pcVar2) {
      iVar14 = iVar14 - (int)pcVar13;
      uVar7 = 0x24a;
      goto LAB_0011a11b;
    }
  }
LAB_0011a139:
  pIVar6 = zsummer::log4z::ILog4zManager::GetInstance();
  pp_Var11 = pIVar6->_vptr_ILog4zManager;
LAB_0011a2f0:
  (*pp_Var11[8])(pIVar6,0,2,pcVar9);
  AcceptClient::Close(*(AcceptClient **)((long)pvVar1 + 0x120));
  return;
}

Assistant:

void AfterRecv(uv_stream_t* handle, ssize_t nread, const uv_buf_t* buf)
{
    TcpClientCtx* theclass = (TcpClientCtx*)handle->data;
    assert(theclass);
    if (nread < 0) {/* Error or EOF */
        if (nread == UV_EOF) {
            fprintf(stdout, "client(%d)eof\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")eof");
        } else if (nread == UV_ECONNRESET) {
            fprintf(stdout, "client(%d)conn reset\n", theclass->clientid);
            LOGW("client(" << theclass->clientid << ")conn reset");
        } else {
            fprintf(stdout, "%s\n", GetUVError(nread).c_str());
            LOGW("client(" << theclass->clientid << ")：" << GetUVError(nread));
        }
        AcceptClient* acceptclient = (AcceptClient*)theclass->parent_acceptclient;
        acceptclient->Close();
        return;
    } else if (0 == nread)  {/* Everything OK, but nothing read. */

    } else {
        theclass->packet_->recvdata((const unsigned char*)buf->base, nread);
    }
}